

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void sysbvm_analysisQueue_waitPendingAnalysis(sysbvm_context_t *context,sysbvm_tuple_t queue)

{
  long lVar1;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_48;
  long local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  sysbvm_tuple_t *psStack_20;
  
  if (queue == 0 || (queue & 0xf) != 0) {
    sysbvm_error("Expected a valid analysis queue.");
  }
  psStack_20 = &local_48;
  local_40 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 2;
  local_48 = queue;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_40 = *(long *)(local_48 + 0x10);
  if (local_40 != 0) {
    do {
      lVar1 = *(long *)(local_40 + 0x18);
      *(long *)(local_48 + 0x10) = lVar1;
      if (lVar1 == 0) {
        *(undefined8 *)(local_48 + 0x18) = 0;
      }
      local_50 = *(sysbvm_tuple_t *)(local_40 + 0x10);
      sysbvm_tuple_send(context,(context->roots).ensureAnalysisSelector,1,&local_50,0);
      local_40 = *(long *)(local_48 + 0x10);
    } while (local_40 != 0);
  }
  sysbvm_stackFrame_popRecord(&local_38);
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisQueue_waitPendingAnalysis(sysbvm_context_t *context, sysbvm_tuple_t queue)
{
    if(!sysbvm_tuple_isNonNullPointer(queue))
        sysbvm_error("Expected a valid analysis queue.");

    struct {
        sysbvm_analysisQueue_t *queue;
        sysbvm_analysisQueueEntry_t *entry;
    } gcFrame = {
        .queue = (sysbvm_analysisQueue_t*)queue,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    while((gcFrame.entry = (sysbvm_analysisQueueEntry_t*)gcFrame.queue->firstEntry) != NULL)
    {
        gcFrame.queue->firstEntry = gcFrame.entry->nextEntry;
        if(!gcFrame.queue->firstEntry)
            gcFrame.queue->lastEntry = SYSBVM_NULL_TUPLE;
        sysbvm_tuple_send0(context, context->roots.ensureAnalysisSelector, gcFrame.entry->programEntity);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}